

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  undefined1 local_88 [8];
  SHA256_CTX context;
  uint8_t *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._56_8_ = digest;
  sha256_Init((SHA256_CTX *)local_88);
  sha256_Update((SHA256_CTX *)local_88,data,len);
  sha256_Final((SHA256_CTX *)local_88,(sha2_byte *)context.buffer._56_8_);
  return;
}

Assistant:

void sha256_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA256_DIGEST_LENGTH]) {
    trezor::SHA256_CTX	context;
	sha256_Init(&context);
	sha256_Update(&context, data, len);
	sha256_Final(&context, digest);
}